

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O0

void __thiscall foxxll::disk_block_allocator::dump(disk_block_allocator *this)

{
  bool bVar1;
  Logger *pLVar2;
  pointer ppVar3;
  Logger local_4b8;
  LoggerVoidify local_339;
  Logger local_338;
  LoggerVoidify local_1b9;
  _Self local_1b8 [3];
  Logger local_1a0;
  LoggerVoidify local_21;
  _Self local_20;
  const_iterator cur;
  uint64_t total;
  disk_block_allocator *this_local;
  
  cur._M_node = (_Base_ptr)0x0;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::begin(&this->free_space_);
  tlx::Logger::Logger(&local_1a0);
  pLVar2 = tlx::Logger::operator<<(&local_1a0,(char (*) [19])"Free regions dump:");
  tlx::LoggerVoidify::operator&(&local_21,pLVar2);
  tlx::Logger::~Logger(&local_1a0);
  while( true ) {
    local_1b8[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->free_space_);
    bVar1 = std::operator!=(&local_20,local_1b8);
    if (!bVar1) break;
    tlx::Logger::Logger(&local_338);
    pLVar2 = tlx::Logger::operator<<(&local_338,(char (*) [20])"Free chunk: begin: ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
             operator->(&local_20);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->first);
    pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [8])0x1bf910);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
             operator->(&local_20);
    pLVar2 = tlx::Logger::operator<<(pLVar2,&ppVar3->second);
    tlx::LoggerVoidify::operator&(&local_1b9,pLVar2);
    tlx::Logger::~Logger(&local_338);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
             operator->(&local_20);
    cur._M_node = (_Base_ptr)((long)&(cur._M_node)->_M_color + ppVar3->second);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
              (&local_20);
  }
  tlx::Logger::Logger(&local_4b8);
  pLVar2 = tlx::Logger::operator<<(&local_4b8,(char (*) [14])"Total bytes: ");
  pLVar2 = tlx::Logger::operator<<(pLVar2,(unsigned_long *)&cur);
  tlx::LoggerVoidify::operator&(&local_339,pLVar2);
  tlx::Logger::~Logger(&local_4b8);
  return;
}

Assistant:

void disk_block_allocator::dump() const
{
    uint64_t total = 0;
    space_map_type::const_iterator cur = free_space_.begin();
    TLX_LOG1 << "Free regions dump:";
    for ( ; cur != free_space_.end(); ++cur)
    {
        TLX_LOG1 << "Free chunk: begin: " << (cur->first) << " size: " << (cur->second);
        total += cur->second;
    }
    TLX_LOG1 << "Total bytes: " << total;
}